

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O0

void __thiscall
biosoup::Sequence::Sequence
          (Sequence *this,char *name,uint32_t name_len,char *data,uint32_t data_len)

{
  char *pcVar1;
  __int_type _Var2;
  ulong uVar3;
  allocator local_3d [16];
  allocator local_2d;
  uint32_t local_2c;
  char *pcStack_28;
  uint32_t data_len_local;
  char *data_local;
  char *pcStack_18;
  uint32_t name_len_local;
  char *name_local;
  Sequence *this_local;
  
  local_2c = data_len;
  pcStack_28 = data;
  data_local._4_4_ = name_len;
  pcStack_18 = name;
  name_local = (char *)this;
  _Var2 = std::__atomic_base<unsigned_int>::operator++
                    (&num_objects.super___atomic_base<unsigned_int>,0);
  pcVar1 = pcStack_18;
  this->id = _Var2;
  uVar3 = (ulong)data_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->name,pcVar1,uVar3,&local_2d);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  pcVar1 = pcStack_28;
  uVar3 = (ulong)local_2c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->data,pcVar1,uVar3,local_3d);
  std::allocator<char>::~allocator((allocator<char> *)local_3d);
  std::__cxx11::string::string((string *)&this->quality);
  return;
}

Assistant:

Sequence(
      const char* name, std::uint32_t name_len,
      const char* data, std::uint32_t data_len)
      : id(num_objects++),
        name(name, name_len),
        data(data, data_len),
        quality() {}